

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

char * LLVMGetErrorMessage(LLVMErrorRef Err)

{
  long lVar1;
  char *__dest;
  void *__src;
  size_t __n;
  Error *E;
  char *ErrMsg;
  Error local_38;
  undefined1 local_30 [8];
  string Tmp;
  LLVMErrorRef Err_local;
  
  Tmp.field_2._8_8_ = Err;
  llvm::unwrap((llvm *)&local_38,Err);
  llvm::toString_abi_cxx11_((string *)local_30,(llvm *)&local_38,E);
  llvm::Error::~Error(&local_38);
  lVar1 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar1 + 1);
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::size();
  memcpy(__dest,__src,__n);
  lVar1 = std::__cxx11::string::size();
  __dest[lVar1] = '\0';
  std::__cxx11::string::~string((string *)local_30);
  return __dest;
}

Assistant:

char *LLVMGetErrorMessage(LLVMErrorRef Err) {
  std::string Tmp = toString(unwrap(Err));
  char *ErrMsg = new char[Tmp.size() + 1];
  memcpy(ErrMsg, Tmp.data(), Tmp.size());
  ErrMsg[Tmp.size()] = '\0';
  return ErrMsg;
}